

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontcombobox.cpp
# Opt level: O2

void __thiscall
QFontFamilyDelegate::QFontFamilyDelegate
          (QFontFamilyDelegate *this,QObject *parent,QFontComboBoxPrivate *comboP)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemDelegate::QAbstractItemDelegate((QAbstractItemDelegate *)this,parent);
  *(undefined ***)&this->super_QAbstractItemDelegate = &PTR_metaObject_007ccda0;
  local_40.d = (Data *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_40.ptr = L":/qt-project.org/styles/commonstyle/images/fonttruetype-16.png";
  local_58.size = 0;
  local_40.size = 0x3e;
  QIcon::QIcon(&this->truetype,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  local_40.d = (Data *)0x0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_40.ptr = L":/qt-project.org/styles/commonstyle/images/fontbitmap-16.png";
  local_58.size = 0;
  local_40.size = 0x3c;
  QIcon::QIcon(&this->bitmap,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  this->writingSystem = Any;
  this->comboPrivate = comboP;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFontFamilyDelegate::QFontFamilyDelegate(QObject *parent, QFontComboBoxPrivate *comboP)
    : QAbstractItemDelegate(parent),
      truetype(QStringLiteral(":/qt-project.org/styles/commonstyle/images/fonttruetype-16.png")),
      bitmap(QStringLiteral(":/qt-project.org/styles/commonstyle/images/fontbitmap-16.png")),
      writingSystem(QFontDatabase::Any),
      comboPrivate(comboP)
{
}